

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::findPaths(QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  Data *vertex;
  size_t sVar1;
  iterator iVar2;
  Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *pNVar3;
  long lVar4;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath> *this_00;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *this_01;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_02;
  long lVar5;
  long in_FS_OFFSET;
  AnchorData *edge;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_d8;
  iterator local_c8;
  undefined1 local_a8 [24];
  Hash local_90;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  local_88;
  AnchorVertex *pAStack_80;
  iterator local_78;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_60;
  QArrayData *local_58;
  long lStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_60.d = (Data *)0x0;
  this_02 = (this->graph).m_data + (long)(int)orientation + -1;
  vertex = (this->graph).m_data[(long)(int)orientation + 1].m_graph.d;
  this_00 = (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath> *)
            ((this->graphPaths).m_data + (long)(int)orientation + -1);
  local_c8.i.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                  *)0x0;
  local_c8.i.bucket = 0;
  local_88.d = vertex;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
  emplace<QtGraphicsAnchorLayout::GraphPath_const&>
            (&local_78,this_00,(AnchorVertex **)&local_88,(GraphPath *)&local_c8);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
            ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)&local_c8.i.bucket);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
            ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)&local_c8);
  local_78.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.i.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                  *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_78,this_02,
             (AnchorVertex *)vertex);
  sVar1 = local_78.i.bucket;
  if (local_78.e != (Chain **)0x0) {
    lVar4 = (long)local_78.e << 3;
    lVar5 = 0;
    do {
      local_c8.i.bucket = *(undefined8 *)(sVar1 + lVar5);
      local_c8.i.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                      *)vertex;
      QtPrivate::
      QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
      ::
      emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                  *)&local_58,local_48,
                 (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)&local_c8);
      QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
      ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
             *)&local_58);
      lVar5 = lVar5 + 8;
    } while (lVar4 != lVar5);
    if (local_48 != 0) {
      do {
        local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pAStack_80 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
        iVar2 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                ::begin((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                         *)&local_58);
        local_88.d = (Data *)(iVar2.i)->first;
        pAStack_80 = (iVar2.i)->second;
        lStack_50 = lStack_50 + 0x10;
        local_48 = local_48 + -1;
        local_90.d = (Data *)Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                             ::edgeData(this_02,(AnchorVertex *)local_88.d,pAStack_80);
        if ((local_60.d == (Data *)0x0) ||
           (pNVar3 = QHashPrivate::
                     Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>>::
                     findNode<QtGraphicsAnchorLayout::AnchorData*>
                               ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>>
                                 *)local_60.d,(AnchorData **)&local_90),
           pNVar3 == (Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)0x0)) {
          local_c8.i.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                          *)local_90.d;
          QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::
          emplace<QHashDummyValue_const&>
                    ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)&local_60,
                     (AnchorData **)&local_c8,(QHashDummyValue *)local_a8);
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::
          value((QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                 *)local_a8,(AnchorVertex **)this_00);
          this_01 = (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                     *)local_a8;
          if ((Data *)(local_90.d)->seed != local_88.d) {
            this_01 = (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                       *)(local_a8 + 8);
          }
          local_c8.i.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                          *)local_90.d;
          QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::
          emplace<QHashDummyValue_const&>
                    ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)this_01,
                     (AnchorData **)&local_c8,(QHashDummyValue *)&local_d8);
          local_d8.first = pAStack_80;
          QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
          emplace<QtGraphicsAnchorLayout::GraphPath_const&>
                    (&local_c8,this_00,&local_d8.first,(GraphPath *)local_a8);
          local_c8.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
          local_c8.i.d = (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                          *)&DAT_aaaaaaaaaaaaaaaa;
          local_c8.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
          adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_c8,this_02,
                           pAStack_80);
          sVar1 = local_c8.i.bucket;
          if (local_c8.e != (Chain **)0x0) {
            lVar4 = (long)local_c8.e << 3;
            lVar5 = 0;
            do {
              local_d8.second = *(AnchorVertex **)(sVar1 + lVar5);
              local_d8.first = pAStack_80;
              QtPrivate::
              QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
              ::
              emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                        ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                          *)&local_58,local_48,&local_d8);
              QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)&local_58);
              lVar5 = lVar5 + 8;
            } while (lVar4 != lVar5);
          }
          if (local_c8.i.d !=
              (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
               *)0x0) {
            LOCK();
            ((local_c8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 ((local_c8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_c8.i.d,8,0x10);
            }
          }
          QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
                    ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)(local_a8 + 8))
          ;
          QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
                    ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)local_a8);
        }
      } while (local_48 != 0);
    }
  }
  identifyFloatItems(this,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_60,orientation);
  if (local_78.i.d !=
      (Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
       *)0x0) {
    LOCK();
    ((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78.i.d,8,0x10);
    }
  }
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_60);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::findPaths(Qt::Orientation orientation)
{
    QQueue<std::pair<AnchorVertex *, AnchorVertex *> > queue;

    QSet<AnchorData *> visited;

    AnchorVertex *root = layoutFirstVertex[orientation];

    graphPaths[orientation].insert(root, GraphPath());

    const auto adjacentVertices = graph[orientation].adjacentVertices(root);
    for (AnchorVertex *v : adjacentVertices)
        queue.enqueue(std::pair(root, v));

    while(!queue.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *>  pair = queue.dequeue();
        AnchorData *edge = graph[orientation].edgeData(pair.first, pair.second);

        if (visited.contains(edge))
            continue;

        visited.insert(edge);
        GraphPath current = graphPaths[orientation].value(pair.first);

        if (edge->from == pair.first)
            current.positives.insert(edge);
        else
            current.negatives.insert(edge);

        graphPaths[orientation].insert(pair.second, current);

        const auto adjacentVertices = graph[orientation].adjacentVertices(pair.second);
        for (AnchorVertex *v : adjacentVertices)
            queue.enqueue(std::pair(pair.second, v));
    }

    // We will walk through every reachable items (non-float) store them in a temporary set.
    // We them create a set of all items and subtract the non-floating items from the set in
    // order to get the floating items. The floating items is then stored in m_floatItems
    identifyFloatItems(visited, orientation);
}